

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O2

void __thiscall pg::FPISolver::runPar(FPISolver *this)

{
  size_t sVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint uVar4;
  int *piVar5;
  ostream *poVar6;
  int strategy;
  ulong uVar7;
  long lVar8;
  uint winner;
  int v;
  ulong uVar9;
  ulong uVar10;
  undefined1 local_68 [64];
  
  bitset::resize(&this->parity,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->distraction,((this->super_Solver).game)->n_vertices);
  sVar1 = (this->parity)._bitssize;
  puVar2 = (this->parity)._bits;
  for (lVar8 = 0; sVar1 << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)puVar2 + lVar8) = 0;
  }
  sVar1 = (this->distraction)._bitssize;
  puVar2 = (this->distraction)._bits;
  for (lVar8 = 0; sVar1 << 3 != lVar8; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)puVar2 + lVar8) = 0;
  }
  uVar9 = ((this->super_Solver).game)->n_vertices;
  uVar10 = uVar9 << 2;
  uVar9 = -(ulong)(uVar9 >> 0x3e != 0) | uVar10;
  piVar5 = (int *)operator_new__(uVar9);
  this->strategy = piVar5;
  piVar5 = (int *)operator_new__(uVar9);
  this->frozen = piVar5;
  memset(piVar5,0,uVar10);
  local_68._0_8_ = fpi_run_par_WRAP;
  local_68._8_8_ = (__pointer_type)0x1;
  local_68._16_8_ = this;
  lace_run_task((Task *)local_68);
  for (uVar9 = 0; (long)uVar9 < ((this->super_Solver).game)->n_vertices; uVar9 = uVar9 + 1) {
    uVar10 = uVar9 >> 6;
    if ((((this->super_Solver).disabled)->_bits[uVar10] >> (uVar9 & 0x3f) & 1) == 0) {
      uVar7 = 1L << (uVar9 & 0x3f);
      uVar3 = (this->parity)._bits[uVar10];
      uVar10 = (this->distraction)._bits[uVar10];
      uVar4 = Solver::owner(&this->super_Solver,(int)uVar9);
      strategy = -1;
      winner = (uint)(((uVar10 & uVar7) != 0) != ((uVar3 & uVar7) != 0));
      if (uVar4 == winner) {
        strategy = this->strategy[uVar9];
      }
      Solver::solve(&this->super_Solver,(int)uVar9,winner,strategy);
    }
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  poVar6 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
  poVar6 = std::operator<<(poVar6," iterations.");
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void
FPISolver::runPar()
{
    /**
     * Allocate and initialize data structures
     */

    parity.resize(nodecount());
    distraction.resize(nodecount());
    parity.reset();
    distraction.reset();
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)

    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    RUN(fpi_run_par, this);

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;
    delete[] frozen;

    logger << "solved with " << iterations << " iterations." << std::endl;
}